

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall
duckdb::UpdateSegment::FetchCommittedRange
          (UpdateSegment *this,idx_t start_row,idx_t count,Vector *result)

{
  idx_t vector_idx;
  fetch_committed_range_function_t p_Var1;
  UpdateInfo *pUVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ulong uVar4;
  long lVar5;
  StorageLockKey *pSVar6;
  ulong uVar7;
  long lVar8;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferPointer entry;
  UndoBufferReference pin;
  StorageLock SStack_98;
  long local_88;
  StorageLockKey *local_80;
  Vector *local_78;
  ulong local_70;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  if ((this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
      super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl != (UpdateNode *)0x0) {
    uVar4 = (count + start_row) - 1;
    SStack_98.internals.internal.
    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(count + start_row);
    uVar7 = uVar4 >> 0xb;
    pSVar6 = (StorageLockKey *)&this->lock;
    local_78 = result;
    StorageLock::GetSharedLock(&SStack_98);
    local_80 = (StorageLockKey *)(ulong)((uint)start_row & 0x7ff);
    SStack_98.internals.internal.
    super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         SStack_98.internals.internal.
         super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi - (uVar4 & 0xfffffffffffff800);
    lVar8 = (start_row & 0xfffffffffffff800) - start_row;
    local_88 = (start_row >> 0xb) - uVar7;
    local_70 = start_row >> 0xb;
    for (lVar5 = 0; vector_idx = local_70 + lVar5, vector_idx <= uVar7; lVar5 = lVar5 + 1) {
      unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::
      operator*((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
                 *)&SStack_98);
      local_68 = GetUpdateNode(this,pSVar6,vector_idx);
      if (local_68.entry != (UndoBufferEntry *)0x0) {
        UndoBufferPointer::Pin(&local_58,&local_68);
        p_Var1 = this->fetch_committed_range;
        pUVar2 = (UpdateInfo *)UndoBufferReference::Ptr(&local_58);
        pSVar6 = (StorageLockKey *)0x0;
        if (lVar5 == 0) {
          pSVar6 = local_80;
        }
        _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if (local_88 + lVar5 == 0) {
          _Var3._M_pi = SStack_98.internals.internal.
                        super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
        (*p_Var1)(pUVar2,(idx_t)pSVar6,(idx_t)_Var3._M_pi,
                  (long)&(pSVar6->internals).internal.
                         super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + lVar8,local_78);
        BufferHandle::~BufferHandle(&local_58.handle);
      }
      lVar8 = lVar8 + 0x800;
    }
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> *)
                &SStack_98);
  }
  return;
}

Assistant:

void UpdateSegment::FetchCommittedRange(idx_t start_row, idx_t count, Vector &result) {
	D_ASSERT(count > 0);
	if (!root) {
		return;
	}
	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);

	idx_t end_row = start_row + count;
	idx_t start_vector = start_row / STANDARD_VECTOR_SIZE;
	idx_t end_vector = (end_row - 1) / STANDARD_VECTOR_SIZE;
	D_ASSERT(start_vector <= end_vector);

	auto lock_handle = lock.GetSharedLock();
	for (idx_t vector_idx = start_vector; vector_idx <= end_vector; vector_idx++) {
		auto entry = GetUpdateNode(*lock_handle, vector_idx);
		if (!entry.IsSet()) {
			continue;
		}
		auto pin = entry.Pin();
		idx_t start_in_vector = vector_idx == start_vector ? start_row - start_vector * STANDARD_VECTOR_SIZE : 0;
		idx_t end_in_vector =
		    vector_idx == end_vector ? end_row - end_vector * STANDARD_VECTOR_SIZE : STANDARD_VECTOR_SIZE;
		D_ASSERT(start_in_vector < end_in_vector);
		D_ASSERT(end_in_vector > 0 && end_in_vector <= STANDARD_VECTOR_SIZE);
		idx_t result_offset = ((vector_idx * STANDARD_VECTOR_SIZE) + start_in_vector) - start_row;
		fetch_committed_range(UpdateInfo::Get(pin), start_in_vector, end_in_vector, result_offset, result);
	}
}